

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

int32_t zng_deflate(zng_stream *strm,int32_t flush)

{
  uchar *puVar1;
  uint8_t uVar2;
  int iVar3;
  uint uVar4;
  deflate_state *s;
  zng_gz_headerp pzVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  ushort uVar8;
  int32_t iVar9;
  int iVar10;
  uint uVar11;
  uint32_t uVar12;
  block_state bVar13;
  ulong uVar14;
  uint uVar15;
  uchar uVar16;
  uint8_t *puVar17;
  uint uVar18;
  uint uVar19;
  uint local_3c;
  
  iVar10 = deflateStateCheck(strm);
  if (5 < (uint)flush) {
    return -2;
  }
  if (iVar10 != 0) {
    return -2;
  }
  if (strm->next_out == (uint8_t *)0x0) {
LAB_001314b5:
    strm->msg = "stream error";
    return -2;
  }
  s = strm->state;
  uVar12 = strm->avail_in;
  if (((uVar12 != 0) && (strm->next_in == (uint8_t *)0x0)) || ((flush != 4 && (s->status == 3))))
  goto LAB_001314b5;
  if (strm->avail_out == 0) {
LAB_00131873:
    strm->msg = "buffer error";
    return -5;
  }
  iVar10 = s->last_flush;
  s->last_flush = flush;
  if (s->pending == 0) {
    if (uVar12 == 0) {
      if ((flush != 4) &&
         ((int)((uint)(flush < 5) * 9 + flush * 2 + -9) <=
          (int)((uint)(iVar10 < 5) * 9 + iVar10 * 2 + -9))) goto LAB_00131873;
    }
  }
  else {
    zng_flush_pending(strm);
    if (strm->avail_out == 0) goto LAB_00131cbd;
  }
  if (s->status == 1) {
    if (s->wrap == 0) {
      s->status = 2;
    }
  }
  else if ((s->status == 3) && (strm->avail_in != 0)) goto LAB_00131873;
  if (s->status == 1) {
    uVar11 = s->w_bits * 0x1000 - 0x7800;
    uVar15 = 0;
    if ((s->strategy < 2) && (iVar10 = s->level, 1 < iVar10)) {
      uVar15 = 0x40;
      if (5 < iVar10) {
        uVar15 = (iVar10 != 6 | 2) << 6;
      }
    }
    uVar4 = uVar15 + 0x20 + uVar11;
    if (s->strstart == 0) {
      uVar4 = uVar15 | uVar11;
    }
    uVar8 = ((short)(uVar4 / 0x1f) - (short)(uVar4 / 0x1f << 5)) + (ushort)uVar4 | (ushort)uVar4;
    *(ushort *)(s->pending_buf + s->pending) = (uVar8 ^ 0x1f) << 8 | uVar8 >> 8;
    uVar11 = s->pending + 2;
    s->pending = uVar11;
    if (s->strstart != 0) {
      uVar15 = strm->adler;
      *(uint *)(s->pending_buf + uVar11) =
           uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
      s->pending = s->pending + 4;
    }
    strm->adler = 1;
    s->status = 2;
    zng_flush_pending(strm);
    if (s->pending != 0) goto LAB_00131cbd;
  }
  if (s->status == 4) {
    (*functable.crc32_fold_reset)(&s->crc_fold);
    uVar11 = s->pending;
    s->pending = uVar11 + 1;
    s->pending_buf[uVar11] = '\x1f';
    uVar11 = s->pending;
    s->pending = uVar11 + 1;
    s->pending_buf[uVar11] = 0x8b;
    uVar11 = s->pending;
    s->pending = uVar11 + 1;
    s->pending_buf[uVar11] = '\b';
    pzVar5 = s->gzhead;
    if (pzVar5 == (zng_gz_headerp)0x0) {
      puVar1 = s->pending_buf + s->pending;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      uVar12 = s->pending;
      s->pending = uVar12 + 5;
      s->pending_buf[uVar12 + 4] = '\0';
      uVar16 = '\x02';
      if (s->level != 9) {
        uVar16 = (s->level < 2 || 1 < s->strategy) << 2;
      }
      uVar11 = s->pending;
      s->pending = uVar11 + 1;
      s->pending_buf[uVar11] = uVar16;
      uVar11 = s->pending;
      s->pending = uVar11 + 1;
      s->pending_buf[uVar11] = '\x03';
      s->status = 2;
      zng_flush_pending(strm);
      if (s->pending != 0) goto LAB_00131cbd;
    }
    else {
      iVar10 = pzVar5->text;
      iVar3 = pzVar5->hcrc;
      puVar17 = pzVar5->extra;
      puVar6 = pzVar5->name;
      puVar7 = pzVar5->comment;
      uVar11 = s->pending;
      s->pending = uVar11 + 1;
      s->pending_buf[uVar11] =
           (puVar7 != (uint8_t *)0x0) << 4 |
           (puVar6 != (uint8_t *)0x0) << 3 |
           (puVar17 != (uint8_t *)0x0) << 2 | (iVar3 != 0) * '\x02' | iVar10 != 0;
      *(int *)(s->pending_buf + s->pending) = (int)s->gzhead->time;
      uVar12 = s->pending;
      uVar11 = uVar12 + 4;
      s->pending = uVar11;
      uVar16 = '\x02';
      if (s->level != 9) {
        uVar16 = (s->level < 2 || 1 < s->strategy) << 2;
      }
      s->pending = uVar12 + 5;
      s->pending_buf[uVar11] = uVar16;
      iVar9 = s->gzhead->os;
      uVar11 = s->pending;
      s->pending = uVar11 + 1;
      s->pending_buf[uVar11] = (uchar)iVar9;
      if (s->gzhead->extra != (uint8_t *)0x0) {
        *(short *)(s->pending_buf + s->pending) = (short)s->gzhead->extra_len;
        s->pending = s->pending + 2;
      }
      if (s->gzhead->hcrc != 0) {
        uVar12 = zng_crc32(strm->adler,s->pending_buf,s->pending);
        strm->adler = uVar12;
      }
      s->gzindex = 0;
      s->status = 5;
    }
  }
  if (s->status == 5) {
    if (s->gzhead->extra != (uint8_t *)0x0) {
      local_3c = s->pending;
      uVar11 = (uint)(ushort)s->gzhead->extra_len - s->gzindex;
      while( true ) {
        uVar15 = s->pending_buf_size;
        uVar4 = s->pending;
        puVar17 = s->gzhead->extra + s->gzindex;
        if (uVar4 + uVar11 <= uVar15) break;
        uVar18 = uVar15 - uVar4;
        memcpy(s->pending_buf + uVar4,puVar17,(ulong)uVar18);
        uVar19 = s->pending_buf_size;
        s->pending = uVar19;
        if ((local_3c <= uVar19 && uVar19 - local_3c != 0) && s->gzhead->hcrc != 0) {
          uVar12 = zng_crc32(strm->adler,s->pending_buf + local_3c,uVar19 - local_3c);
          strm->adler = uVar12;
        }
        s->gzindex = s->gzindex + uVar18;
        zng_flush_pending(strm);
        if (s->pending != 0) {
          s->last_flush = -1;
          goto LAB_0013195d;
        }
        uVar11 = uVar11 - uVar18;
        local_3c = 0;
      }
      memcpy(s->pending_buf + uVar4,puVar17,(ulong)uVar11);
      uVar19 = uVar11 + s->pending;
      s->pending = uVar19;
      if ((s->gzhead->hcrc != 0) && (local_3c <= uVar19 && uVar19 - local_3c != 0)) {
        uVar12 = zng_crc32(strm->adler,s->pending_buf + local_3c,uVar19 - local_3c);
        strm->adler = uVar12;
      }
      s->gzindex = 0;
LAB_0013195d:
      if (uVar15 < uVar4 + uVar11) {
        return 0;
      }
    }
    s->status = 6;
  }
  if (s->status == 6) {
    if (s->gzhead->name != (uint8_t *)0x0) {
      uVar14 = (ulong)s->pending;
      do {
        uVar11 = s->pending;
        if (uVar11 == s->pending_buf_size) {
          uVar12 = uVar11 - (uint)uVar14;
          if (((uint)uVar14 <= uVar11 && uVar12 != 0) && s->gzhead->hcrc != 0) {
            uVar12 = zng_crc32(strm->adler,s->pending_buf + uVar14,uVar12);
            strm->adler = uVar12;
          }
          zng_flush_pending(strm);
          uVar14 = 0;
          if (s->pending != 0) goto LAB_00131cbd;
        }
        puVar17 = s->gzhead->name;
        uVar11 = s->gzindex;
        s->gzindex = uVar11 + 1;
        uVar2 = puVar17[uVar11];
        uVar11 = s->pending;
        s->pending = uVar11 + 1;
        s->pending_buf[uVar11] = uVar2;
      } while (uVar2 != '\0');
      if ((s->gzhead->hcrc != 0) &&
         (uVar12 = s->pending - (uint)uVar14, (uint)uVar14 <= s->pending && uVar12 != 0)) {
        uVar12 = zng_crc32(strm->adler,s->pending_buf + uVar14,uVar12);
        strm->adler = uVar12;
      }
      s->gzindex = 0;
    }
    s->status = 7;
  }
  if (s->status == 7) {
    if (s->gzhead->comment != (uint8_t *)0x0) {
      uVar14 = (ulong)s->pending;
      do {
        uVar11 = s->pending;
        if (uVar11 == s->pending_buf_size) {
          uVar12 = uVar11 - (uint)uVar14;
          if (((uint)uVar14 <= uVar11 && uVar12 != 0) && s->gzhead->hcrc != 0) {
            uVar12 = zng_crc32(strm->adler,s->pending_buf + uVar14,uVar12);
            strm->adler = uVar12;
          }
          zng_flush_pending(strm);
          uVar14 = 0;
          if (s->pending != 0) goto LAB_00131cbd;
        }
        puVar17 = s->gzhead->comment;
        uVar11 = s->gzindex;
        s->gzindex = uVar11 + 1;
        uVar2 = puVar17[uVar11];
        uVar11 = s->pending;
        s->pending = uVar11 + 1;
        s->pending_buf[uVar11] = uVar2;
      } while (uVar2 != '\0');
      if ((s->gzhead->hcrc != 0) &&
         (uVar12 = s->pending - (uint)uVar14, (uint)uVar14 <= s->pending && uVar12 != 0)) {
        uVar12 = zng_crc32(strm->adler,s->pending_buf + uVar14,uVar12);
        strm->adler = uVar12;
      }
    }
    s->status = 8;
  }
  if (s->status == 8) {
    if (s->gzhead->hcrc != 0) {
      if ((s->pending_buf_size < s->pending + 2) && (zng_flush_pending(strm), s->pending != 0))
      goto LAB_00131cbd;
      *(short *)(s->pending_buf + s->pending) = (short)strm->adler;
      s->pending = s->pending + 2;
      (*functable.crc32_fold_reset)(&s->crc_fold);
    }
    s->status = 2;
    zng_flush_pending(strm);
    if (s->pending != 0) goto LAB_00131cbd;
  }
  if (((strm->avail_in != 0) || (s->lookahead != 0)) || ((flush != 0 && (s->status != 3)))) {
    if ((long)s->level == 0) {
      bVar13 = deflate_stored(s,flush);
    }
    else if (s->strategy == 3) {
      bVar13 = deflate_rle(s,flush);
    }
    else if (s->strategy == 2) {
      bVar13 = deflate_huff(s,flush);
    }
    else {
      bVar13 = (*configuration_table[s->level].func)(s,flush);
    }
    if ((bVar13 & ~block_done) == finish_started) {
      s->status = 3;
    }
    if ((bVar13 & ~finish_started) == need_more) {
      if (strm->avail_out == 0) {
        s->last_flush = -1;
        return 0;
      }
      return 0;
    }
    if (bVar13 == block_done) {
      if (flush != 5) {
        if (flush == 1) {
          zng_tr_align(s);
        }
        else {
          zng_tr_stored_block(s,(char *)0x0,0,0);
          if ((flush == 3) && (memset(s->head,0,0x20000), s->lookahead == 0)) {
            s->strstart = 0;
            s->block_start = 0;
            s->insert = 0;
          }
        }
      }
      zng_flush_pending(strm);
      if (strm->avail_out == 0) {
LAB_00131cbd:
        s->last_flush = -1;
        return 0;
      }
    }
  }
  if (flush != 4) {
    return 0;
  }
  if (s->wrap == 1) {
    uVar11 = strm->adler;
    uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    uVar12 = s->pending;
  }
  else {
    if (s->wrap != 2) goto LAB_00131ce3;
    uVar12 = (*functable.crc32_fold_final)(&s->crc_fold);
    strm->adler = uVar12;
    *(uint32_t *)(s->pending_buf + s->pending) = uVar12;
    uVar12 = s->pending + 4;
    s->pending = uVar12;
    uVar11 = (uint)strm->total_in;
  }
  *(uint *)(s->pending_buf + uVar12) = uVar11;
  s->pending = s->pending + 4;
LAB_00131ce3:
  zng_flush_pending(strm);
  if (0 < s->wrap) {
    s->wrap = -s->wrap;
  }
  return (uint)(s->pending == 0);
}

Assistant:

int32_t Z_EXPORT PREFIX(deflate)(PREFIX3(stream) *strm, int32_t flush) {
    int32_t old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (deflateStateCheck(strm) || flush > Z_BLOCK || flush < 0)
        return Z_STREAM_ERROR;
    s = strm->state;

    if (strm->next_out == NULL || (strm->avail_in != 0 && strm->next_in == NULL)
        || (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        PREFIX(flush_pending)(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

        /* Make sure there is something to do and avoid duplicate consecutive
         * flushes. For repeated and useless calls with Z_FINISH, we keep
         * returning Z_STREAM_END instead of Z_BUF_ERROR.
         */
    } else if (strm->avail_in == 0 && RANK(flush) <= RANK(old_flush) && flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0)   {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Write the header */
    if (s->status == INIT_STATE && s->wrap == 0)
        s->status = BUSY_STATE;
    if (s->status == INIT_STATE) {
        /* zlib header */
        unsigned int header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
        unsigned int level_flags;

        if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
            level_flags = 0;
        else if (s->level < 6)
            level_flags = 1;
        else if (s->level == 6)
            level_flags = 2;
        else
            level_flags = 3;
        header |= (level_flags << 6);
        if (s->strstart != 0)
            header |= PRESET_DICT;
        header += 31 - (header % 31);

        put_short_msb(s, (uint16_t)header);

        /* Save the adler32 of the preset dictionary: */
        if (s->strstart != 0)
            put_uint32_msb(s, strm->adler);
        strm->adler = ADLER32_INITIAL_VALUE;
        s->status = BUSY_STATE;

        /* Compression must start with an empty pending buffer */
        PREFIX(flush_pending)(strm);
        if (s->pending != 0) {
            s->last_flush = -1;
            return Z_OK;
        }
    }
#ifdef GZIP
    if (s->status == GZIP_STATE) {
        /* gzip header */
        FUNCTABLE_CALL(crc32_fold_reset)(&s->crc_fold);
        put_byte(s, 31);
        put_byte(s, 139);
        put_byte(s, 8);
        if (s->gzhead == NULL) {
            put_uint32(s, 0);
            put_byte(s, 0);
            put_byte(s, s->level == 9 ? 2 :
                     (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ? 4 : 0));
            put_byte(s, OS_CODE);
            s->status = BUSY_STATE;

            /* Compression must start with an empty pending buffer */
            PREFIX(flush_pending)(strm);
            if (s->pending != 0) {
                s->last_flush = -1;
                return Z_OK;
            }
        } else {
            put_byte(s, (s->gzhead->text ? 1 : 0) +
                     (s->gzhead->hcrc ? 2 : 0) +
                     (s->gzhead->extra == NULL ? 0 : 4) +
                     (s->gzhead->name == NULL ? 0 : 8) +
                     (s->gzhead->comment == NULL ? 0 : 16)
                     );
            put_uint32(s, s->gzhead->time);
            put_byte(s, s->level == 9 ? 2 : (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ? 4 : 0));
            put_byte(s, s->gzhead->os & 0xff);
            if (s->gzhead->extra != NULL)
                put_short(s, (uint16_t)s->gzhead->extra_len);
            if (s->gzhead->hcrc)
                strm->adler = PREFIX(crc32)(strm->adler, s->pending_buf, s->pending);
            s->gzindex = 0;
            s->status = EXTRA_STATE;
        }
    }
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != NULL) {
            uint32_t beg = s->pending;   /* start of bytes to update crc */
            uint32_t left = (s->gzhead->extra_len & 0xffff) - s->gzindex;

            while (s->pending + left > s->pending_buf_size) {
                uint32_t copy = s->pending_buf_size - s->pending;
                memcpy(s->pending_buf + s->pending, s->gzhead->extra + s->gzindex, copy);
                s->pending = s->pending_buf_size;
                HCRC_UPDATE(beg);
                s->gzindex += copy;
                PREFIX(flush_pending)(strm);
                if (s->pending != 0) {
                    s->last_flush = -1;
                    return Z_OK;
                }
                beg = 0;
                left -= copy;
            }
            memcpy(s->pending_buf + s->pending, s->gzhead->extra + s->gzindex, left);
            s->pending += left;
            HCRC_UPDATE(beg);
            s->gzindex = 0;
        }
        s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != NULL) {
            uint32_t beg = s->pending;   /* start of bytes to update crc */
            unsigned char val;

            do {
                if (s->pending == s->pending_buf_size) {
                    HCRC_UPDATE(beg);
                    PREFIX(flush_pending)(strm);
                    if (s->pending != 0) {
                        s->last_flush = -1;
                        return Z_OK;
                    }
                    beg = 0;
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            HCRC_UPDATE(beg);
            s->gzindex = 0;
        }
        s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != NULL) {
            uint32_t beg = s->pending;  /* start of bytes to update crc */
            unsigned char val;

            do {
                if (s->pending == s->pending_buf_size) {
                    HCRC_UPDATE(beg);
                    PREFIX(flush_pending)(strm);
                    if (s->pending != 0) {
                        s->last_flush = -1;
                        return Z_OK;
                    }
                    beg = 0;
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            HCRC_UPDATE(beg);
        }
        s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size) {
                PREFIX(flush_pending)(strm);
                if (s->pending != 0) {
                    s->last_flush = -1;
                    return Z_OK;
                }
            }
            put_short(s, (uint16_t)strm->adler);
            FUNCTABLE_CALL(crc32_fold_reset)(&s->crc_fold);
        }
        s->status = BUSY_STATE;

        /* Compression must start with an empty pending buffer */
        PREFIX(flush_pending)(strm);
        if (s->pending != 0) {
            s->last_flush = -1;
            return Z_OK;
        }
    }
#endif

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 || (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = DEFLATE_HOOK(strm, flush, &bstate) ? bstate :  /* hook for IBM Z DFLTCC */
                 s->level == 0 ? deflate_stored(s, flush) :
                 s->strategy == Z_HUFFMAN_ONLY ? deflate_huff(s, flush) :
                 s->strategy == Z_RLE ? deflate_rle(s, flush) :
                 (*(configuration_table[s->level].func))(s, flush);

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                zng_tr_align(s);
            } else if (flush != Z_BLOCK) { /* FULL_FLUSH or SYNC_FLUSH */
                zng_tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                    if (s->lookahead == 0) {
                        s->strstart = 0;
                        s->block_start = 0;
                        s->insert = 0;
                    }
                }
            }
            PREFIX(flush_pending)(strm);
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
                return Z_OK;
            }
        }
    }

    if (flush != Z_FINISH)
        return Z_OK;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        strm->adler = FUNCTABLE_CALL(crc32_fold_final)(&s->crc_fold);

        put_uint32(s, strm->adler);
        put_uint32(s, (uint32_t)strm->total_in);
    } else
#endif
    {
        if (s->wrap == 1)
            put_uint32_msb(s, strm->adler);
    }
    PREFIX(flush_pending)(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0)
        s->wrap = -s->wrap; /* write the trailer only once! */
    if (s->pending == 0) {
        Assert(s->bi_valid == 0, "bi_buf not flushed");
        return Z_STREAM_END;
    }
    return Z_OK;
}